

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.h
# Opt level: O0

set<Token,_std::less<Token>,_std::allocator<Token>_> * __thiscall
Thread::extractTokens(Thread *this)

{
  set<Token,_std::less<Token>,_std::allocator<Token>_> *in_RDI;
  string *in_stack_000000b0;
  ResponseBase *in_stack_000000b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  string local_30 [48];
  
  std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  ResponseBase::extractTokensFromLine(in_stack_000000b8,in_stack_000000b0);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::set<Token> extractTokens() const {
			return extractTokensFromLine(selftext + title);
		}